

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O1

bool IsMeshInVerboseFormat(aiMesh *mesh)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  aiFace *paVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> seen;
  allocator_type local_2d;
  value_type_conflict4 local_2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  local_2c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_28,(ulong)mesh->mNumVertices,&local_2c,&local_2d);
  bVar7 = mesh->mNumFaces == 0;
  if (!bVar7) {
    uVar3 = 0;
    do {
      if (mesh->mFaces[uVar3].mNumIndices != 0) {
        paVar4 = mesh->mFaces + uVar3;
        lVar5 = 0;
        do {
          uVar1 = paVar4->mIndices[lVar5];
          uVar2 = local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1];
          local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1] = uVar2 + 1;
          if (uVar2 + 1 == 2) goto LAB_003ba60b;
          lVar5 = lVar5 + 1;
        } while ((uint)lVar5 < paVar4->mNumIndices);
      }
      uVar3 = uVar3 + 1;
      bVar6 = uVar3 < mesh->mNumFaces;
      bVar7 = !bVar6;
    } while (bVar6);
  }
LAB_003ba60b:
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool IsMeshInVerboseFormat(const aiMesh* mesh) {
    // avoid slow vector<bool> specialization
    std::vector<unsigned int> seen(mesh->mNumVertices,0);
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        const aiFace& f = mesh->mFaces[i];
        for(unsigned int j = 0; j < f.mNumIndices; ++j) {
            if(++seen[f.mIndices[j]] == 2) {
                // found a duplicate index
                return false;
            }
        }
    }

    return true;
}